

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void SobelYRow_C(uint8 *src_y0,uint8 *src_y1,uint8 *dst_sobely,int width)

{
  int iVar1;
  ulong uVar2;
  uint8 uVar3;
  int iVar4;
  
  if (0 < width) {
    uVar2 = 0;
    do {
      iVar1 = (((uint)src_y0[uVar2 + 2] + (uint)src_y0[uVar2]) -
              ((uint)src_y1[uVar2 + 2] + (uint)src_y1[uVar2])) +
              ((uint)src_y0[uVar2 + 1] - (uint)src_y1[uVar2 + 1]) * 2;
      iVar4 = -iVar1;
      if (0 < iVar1) {
        iVar4 = iVar1;
      }
      uVar3 = (uint8)iVar4;
      if (0xfe < iVar4) {
        uVar3 = 0xff;
      }
      dst_sobely[uVar2] = uVar3;
      uVar2 = uVar2 + 1;
    } while ((uint)width != uVar2);
  }
  return;
}

Assistant:

void SobelYRow_C(const uint8* src_y0,
                 const uint8* src_y1,
                 uint8* dst_sobely,
                 int width) {
  int i;
  for (i = 0; i < width; ++i) {
    int a = src_y0[i + 0];
    int b = src_y0[i + 1];
    int c = src_y0[i + 2];
    int a_sub = src_y1[i + 0];
    int b_sub = src_y1[i + 1];
    int c_sub = src_y1[i + 2];
    int a_diff = a - a_sub;
    int b_diff = b - b_sub;
    int c_diff = c - c_sub;
    int sobel = Abs(a_diff + b_diff * 2 + c_diff);
    dst_sobely[i] = (uint8)(clamp255(sobel));
  }
}